

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
::Data(Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
       *this,Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
             *other,size_t reserved)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  *pNVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  size_t numBuckets;
  long lVar10;
  R RVar11;
  Bucket BVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar2 = other->size;
  this->size = uVar2;
  if (reserved < uVar2) {
    reserved = uVar2;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar11 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar11.spans;
  uVar2 = other->numBuckets;
  if (0x7f < uVar2) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pSVar3 = other->spans;
      lVar10 = 0;
      do {
        bVar1 = pSVar3->offsets[lVar10 + lVar8];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar9].entries;
          uVar7 = *(ulong *)pEVar4[bVar1].storage.data;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          uVar7 = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d;
          BVar12 = Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>>
                   ::findBucketWithHash<QtGraphicsAnchorLayout::AnchorVertex*>
                             ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>>
                               *)this,(AnchorVertex **)(pEVar4 + bVar1),
                              uVar7 >> 0x20 ^ this->seed ^ uVar7);
          pNVar6 = Span<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
                   ::insert(BVar12.span,BVar12.index);
          pNVar6->key = *(AnchorVertex **)pEVar4[bVar1].storage.data;
          pDVar5 = *(Data **)(pEVar4[bVar1].storage.data + 8);
          (pNVar6->value).d = pDVar5;
          if ((pDVar5 != (Data *)0x0) &&
             ((pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
            LOCK();
            (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x90;
    } while (uVar9 != uVar2 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }